

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_os_mkdir(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val1;
  JSValue val;
  JSValue JVar1;
  int iVar2;
  char *__path;
  ssize_t sVar3;
  int in_ECX;
  undefined8 in_RDX;
  JSContext *in_RSI;
  int32_t *in_RDI;
  char *in_R8;
  char *path;
  int ret;
  int mode;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  __mode_t in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 local_28;
  undefined4 uStack_c;
  
  if (in_ECX < 2) {
    in_stack_ffffffffffffffa4 = 0x1ff;
  }
  else {
    val.tag._0_4_ = in_stack_ffffffffffffffd0;
    val.u = (JSValueUnion)in_RDX;
    val.tag._4_4_ = in_stack_ffffffffffffffd4;
    iVar2 = JS_ToInt32(in_RSI,in_RDI,val);
    if (iVar2 != 0) {
      uVar4 = 0;
      local_28 = 6;
      goto LAB_001159a6;
    }
  }
  val1.tag._0_4_ = in_stack_ffffffffffffffa0;
  val1.u = (JSValueUnion)in_stack_ffffffffffffff98;
  val1.tag._4_4_ = in_stack_ffffffffffffffa4;
  __path = JS_ToCString((JSContext *)0x11592a,val1);
  if (__path == (char *)0x0) {
    uVar4 = 0;
    local_28 = 6;
  }
  else {
    mkdir(__path,in_stack_ffffffffffffffa4);
    sVar3 = js_get_errno(0x11595d);
    uVar4 = (undefined4)sVar3;
    JS_FreeCString((JSContext *)CONCAT44(in_ECX,in_stack_ffffffffffffffb0),in_R8);
    local_28 = 0;
    in_stack_ffffffffffffffd4 = uStack_c;
  }
LAB_001159a6:
  JVar1.u._4_4_ = in_stack_ffffffffffffffd4;
  JVar1.u.int32 = uVar4;
  JVar1.tag = local_28;
  return JVar1;
}

Assistant:

static JSValue js_os_mkdir(JSContext *ctx, JSValueConst this_val,
                           int argc, JSValueConst *argv)
{
    int mode, ret;
    const char *path;
    
    if (argc >= 2) {
        if (JS_ToInt32(ctx, &mode, argv[1]))
            return JS_EXCEPTION;
    } else {
        mode = 0777;
    }
    path = JS_ToCString(ctx, argv[0]);
    if (!path)
        return JS_EXCEPTION;
#if defined(_WIN32)
    (void)mode;
    ret = js_get_errno(mkdir(path));
#else
    ret = js_get_errno(mkdir(path, mode));
#endif
    JS_FreeCString(ctx, path);
    return JS_NewInt32(ctx, ret);
}